

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_binary_arith_slow(JSContext *ctx,JSValue *sp,OPCodeEnum op)

{
  JSValue val;
  JSValue v;
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  anon_union_8_2_94730072 u;
  double dVar5;
  double d2;
  double d1;
  
  v = sp[-1];
  val = sp[-1];
  iVar1 = JS_ToFloat64Free(ctx,&d1,sp[-2]);
  if (iVar1 == 0) {
    iVar1 = JS_ToFloat64Free(ctx,&d2,val);
    if (iVar1 == 0) {
      switch(op) {
      case OP_mul:
        dVar5 = d1 * d2;
        break;
      case OP_div:
        dVar5 = d1 / d2;
        break;
      case OP_mod:
        dVar5 = fmod(d1,d2);
        break;
      default:
        abort();
      case OP_sub:
        dVar5 = d1 - d2;
        break;
      case OP_pow:
        if ((((ulong)ABS(d2) < 0x7ff0000000000000) || (ABS(d1) != 1.0)) || (NAN(ABS(d1)))) {
          dVar5 = pow(d1,d2);
        }
        else {
          dVar5 = NAN;
        }
      }
      uVar3 = (ulong)dVar5 & 0xffffffff;
      uVar4 = (ulong)dVar5 & 0xffffffff00000000;
      if (dVar5 == (double)(int)dVar5) {
        uVar3 = (ulong)(uint)(int)dVar5;
        uVar4 = 0;
      }
      uVar2 = 7;
      if (dVar5 == (double)(int)dVar5) {
        uVar2 = 0;
      }
      sp[-2].u.ptr = (void *)(uVar3 | uVar4);
      sp[-2].tag = uVar2;
      return 0;
    }
  }
  else {
    JS_FreeValue(ctx,v);
  }
  sp[-2].u.int32 = 0;
  sp[-2].tag = 3;
  sp[-1].u.int32 = 0;
  sp[-1].tag = 3;
  return -1;
}

Assistant:

int js_binary_arith_slow(JSContext *ctx, JSValue *sp,
                                                      OPCodeEnum op)
{
    JSValue op1, op2;
    double d1, d2, r;

    op1 = sp[-2];
    op2 = sp[-1];
    if (unlikely(JS_ToFloat64Free(ctx, &d1, op1))) {
        JS_FreeValue(ctx, op2);
        goto exception;
    }
    if (unlikely(JS_ToFloat64Free(ctx, &d2, op2))) {
        goto exception;
    }
    switch(op) {
    case OP_sub:
        r = d1 - d2;
        break;
    case OP_mul:
        r = d1 * d2;
        break;
    case OP_div:
        r = d1 / d2;
        break;
    case OP_mod:
        r = fmod(d1, d2);
        break;
    case OP_pow:
        r = js_pow(d1, d2);
        break;
    default:
        abort();
    }
    sp[-2] = JS_NewFloat64(ctx, r);
    return 0;
 exception:
    sp[-2] = JS_UNDEFINED;
    sp[-1] = JS_UNDEFINED;
    return -1;
}